

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O0

void * rec_del(pfx_table *pfxt)

{
  __pid_t _Var1;
  uint32_t uVar2;
  int iVar3;
  long in_FS_OFFSET;
  uint32_t local_48;
  uint32_t i;
  int tid;
  pfx_table *pfxt_local;
  pfx_record rec;
  
  rec.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  _Var1 = getpid();
  rec.prefix.u.addr6.addr[2]._0_1_ = 0x20;
  rec.prefix.u.addr6.addr[2]._1_1_ = 0x20;
  pfxt_local._4_4_ = 0;
  rec.asn = 0;
  printf("removing records\n");
  for (local_48 = max_i; min_i <= local_48; local_48 = local_48 - 1) {
    rec.min_len = '\0';
    rec.max_len = '\0';
    rec._26_6_ = 0;
    rec.prefix.u.addr6.addr[2]._0_1_ = 0x20;
    rec.prefix.u.addr6.addr[2]._1_1_ = 0x20;
    pfxt_local._0_4_ = _Var1 % 2;
    pfxt_local._4_4_ = 0;
    rec.asn = htonl(local_48);
    pfx_table_remove(pfxt,(pfx_record *)&pfxt_local);
    pfxt_local._0_4_ = _Var1 % 2 + 1;
    pfx_table_remove(pfxt,(pfx_record *)&pfxt_local);
    pfxt_local._4_4_ = 1;
    rec.prefix.u.addr6.addr[2]._0_1_ = 0x80;
    rec.prefix.u.addr6.addr[2]._1_1_ = 0x80;
    rec.prefix.ver = min_i - LRTR_IPV6;
    uVar2 = htonl(local_48);
    rec.asn = uVar2 - 1;
    pfx_table_remove(pfxt,(pfx_record *)&pfxt_local);
    iVar3 = rand();
    usleep(iVar3 / 0x6666666);
  }
  printf("Done\n");
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == rec.socket) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *rec_del(struct pfx_table *pfxt)
{
	const int tid = getpid();
	struct pfx_record rec;

	rec.min_len = 32;
	rec.max_len = 32;
	rec.prefix.ver = LRTR_IPV4;
	rec.prefix.u.addr4.addr = 0;
	printf("removing records\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		rec.socket = NULL;
		rec.min_len = 32;
		rec.max_len = 32;
		rec.asn = tid % 2;
		rec.prefix.ver = LRTR_IPV4;
		rec.prefix.u.addr4.addr = htonl(i);
		pfx_table_remove(pfxt, &rec);
		rec.asn = (tid % 2) + 1;
		pfx_table_remove(pfxt, &rec);

		rec.prefix.ver = LRTR_IPV6;
		rec.min_len = 128;
		rec.max_len = 128;
		rec.prefix.u.addr6.addr[1] = min_i + 0xFFFFFFFF;
		rec.prefix.u.addr6.addr[0] = htonl(i) + 0xFFFFFFFF;

		pfx_table_remove(pfxt, &rec);
		usleep(rand() / (RAND_MAX / 20));
	}
	printf("Done\n");

	return NULL;
}